

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O0

int YM_SET(ym2612_ *YM2612,int Adr,uchar data)

{
  channel_ *CH_00;
  int iVar1;
  uint local_2c;
  int nch;
  channel_ *CH;
  uchar data_local;
  int Adr_local;
  ym2612_ *YM2612_local;
  
  switch(Adr) {
  case 0x22:
    if ((data & 8) == 0) {
      YM2612->LFOcnt = 0;
      YM2612->LFOinc = 0;
    }
    else {
      YM2612->LFOinc = YM2612->LFO_INC_TAB[(int)(data & 7)];
    }
    break;
  case 0x24:
    YM2612->TimerA = YM2612->TimerA & 3U | (uint)data << 2;
    if (YM2612->TimerAL != (0x400 - YM2612->TimerA) * 0x1000) {
      iVar1 = (0x400 - YM2612->TimerA) * 0x1000;
      YM2612->TimerAL = iVar1;
      YM2612->TimerAcnt = iVar1;
    }
    break;
  case 0x25:
    YM2612->TimerA = YM2612->TimerA & 0x3fcU | data & 3;
    if (YM2612->TimerAL != (0x400 - YM2612->TimerA) * 0x1000) {
      iVar1 = (0x400 - YM2612->TimerA) * 0x1000;
      YM2612->TimerAL = iVar1;
      YM2612->TimerAcnt = iVar1;
    }
    break;
  case 0x26:
    YM2612->TimerB = (uint)data;
    if (YM2612->TimerBL != (0x100 - YM2612->TimerB) * 0x10000) {
      iVar1 = (0x100 - YM2612->TimerB) * 0x10000;
      YM2612->TimerBL = iVar1;
      YM2612->TimerBcnt = iVar1;
    }
    break;
  case 0x27:
    if (((data ^ YM2612->Mode) & 0x40) != 0) {
      YM2612_Special_Update(YM2612);
      YM2612->CHANNEL[2].SLOT[0].Finc = -1;
    }
    YM2612->Status = (int)(data ^ 0xffffffff) >> 4 & (int)(uint)data >> 2 & YM2612->Status;
    YM2612->Mode = data;
    break;
  case 0x28:
    local_2c = data & 3;
    if (local_2c == 3) {
      return 1;
    }
    if ((data & 4) != 0) {
      local_2c = local_2c + 3;
    }
    CH_00 = YM2612->CHANNEL + (int)local_2c;
    YM2612_Special_Update(YM2612);
    if ((data & 0x10) == 0) {
      KEY_OFF(CH_00,0);
    }
    else {
      KEY_ON(CH_00,0);
    }
    if ((data & 0x20) == 0) {
      KEY_OFF(CH_00,2);
    }
    else {
      KEY_ON(CH_00,2);
    }
    if ((data & 0x40) == 0) {
      KEY_OFF(CH_00,1);
    }
    else {
      KEY_ON(CH_00,1);
    }
    if ((data & 0x80) == 0) {
      KEY_OFF(CH_00,3);
    }
    else {
      KEY_ON(CH_00,3);
    }
    break;
  case 0x2a:
    YM2612->DACdata = (data - 0x80) * 0x40;
    break;
  case 0x2b:
    if (YM2612->DAC != (data & 0x80)) {
      YM2612_Special_Update(YM2612);
    }
    YM2612->DAC = data & 0x80;
  }
  return 0;
}

Assistant:

static
int YM_SET(ym2612_ *YM2612, int Adr, unsigned char data)
{
  channel_ *CH;
  int nch;

  switch(Adr)
  {
    case 0x22:
      if (data & 8)
      {
        // Cool Spot music 1, LFO modified severals time which
        // distord the sound, have to check that on a real genesis...

        YM2612->LFOinc = YM2612->LFO_INC_TAB[data & 7];

#if YM_DEBUG_LEVEL > 0
        fprintf(debug_file, "\nLFO Enable, LFOinc = %.8X   %d\n", YM2612->LFOinc, data & 7);
#endif
      }
      else
      {
        YM2612->LFOinc = YM2612->LFOcnt = 0;

#if YM_DEBUG_LEVEL > 0
        fprintf(debug_file, "\nLFO Disable\n");
#endif
      }
      break;

    case 0x24:
      YM2612->TimerA = (YM2612->TimerA & 0x003) | (((int) data) << 2);

      if (YM2612->TimerAL != (1024 - YM2612->TimerA) << 12)
      {
        YM2612->TimerAcnt = YM2612->TimerAL = (1024 - YM2612->TimerA) << 12;

#if YM_DEBUG_LEVEL > 1
        fprintf(debug_file, "Timer A Set = %.8X\n", YM2612->TimerAcnt);
#endif
      }
      break;

    case 0x25:
      YM2612->TimerA = (YM2612->TimerA & 0x3fc) | (data & 3);

      if (YM2612->TimerAL != (1024 - YM2612->TimerA) << 12)
      {
        YM2612->TimerAcnt = YM2612->TimerAL = (1024 - YM2612->TimerA) << 12;

#if YM_DEBUG_LEVEL > 1
        fprintf(debug_file, "Timer A Set = %.8X\n", YM2612->TimerAcnt);
#endif
      }
      break;

    case 0x26:
      YM2612->TimerB = data;

      if (YM2612->TimerBL != (256 - YM2612->TimerB) << (4 + 12))
      {
        YM2612->TimerBcnt = YM2612->TimerBL = (256 - YM2612->TimerB) << (4 + 12);

#if YM_DEBUG_LEVEL > 1
        fprintf(debug_file, "Timer B Set = %.8X\n", YM2612->TimerBcnt);
#endif
      }
      break;

    case 0x27:
      // Paramètre divers
      // b7 = CSM MODE
      // b6 = 3 slot mode
      // b5 = reset b
      // b4 = reset a
      // b3 = timer enable b
      // b2 = timer enable a
      // b1 = load b
      // b0 = load a

      if ((data ^ YM2612->Mode) & 0x40)
      {
        // We changed the channel 2 mode, so recalculate phase step
        // This fix the punch sound in Street of Rage 2

        YM2612_Special_Update(YM2612);

        YM2612->CHANNEL[2].SLOT[0].Finc = -1;    // recalculate phase step
      }

      /*
      if ((data & 2) && (YM2612->Status & 2))
        YM2612->TimerBcnt = YM2612->TimerBL;
      if ((data & 1) && (YM2612->Status & 1))
        YM2612->TimerAcnt = YM2612->TimerAL;
      */

      //YM2612->Status &= (~data >> 4);   // Reset du Status au cas ou c'est demandé
      YM2612->Status &= (~data >> 4) & (data >> 2);     // Reset Status

      YM2612->Mode = data;

#if YM_DEBUG_LEVEL > 0
      fprintf(debug_file, "Mode reg = %.2X\n", data);
#endif
      break;

    case 0x28:
      if ((nch = data & 3) == 3)
        return 1;

      if (data & 4)
        nch += 3;
      CH = &(YM2612->CHANNEL[nch]);

      YM2612_Special_Update(YM2612);

      if (data & 0x10)
        KEY_ON(CH, S0);         // On appuie sur la touche pour le slot 1
      else
        KEY_OFF(CH, S0);        // On relâche la touche pour le slot 1
      if (data & 0x20)
        KEY_ON(CH, S1);         // On appuie sur la touche pour le slot 3
      else
        KEY_OFF(CH, S1);        // On relâche la touche pour le slot 3
      if (data & 0x40)
        KEY_ON(CH, S2);         // On appuie sur la touche pour le slot 2
      else
        KEY_OFF(CH, S2);        // On relâche la touche pour le slot 2
      if (data & 0x80)
        KEY_ON(CH, S3);         // On appuie sur la touche pour le slot 4
      else
        KEY_OFF(CH, S3);        // On relâche la touche pour le slot 4

#if YM_DEBUG_LEVEL > 0
      fprintf(debug_file, "CHANNEL[%d]  KEY %.1X\n", nch, ((data & 0xf0) >> 4));
#endif
      break;

    case 0x2A:
      YM2612->DACdata = ((int) data - 0x80) << DAC_SHIFT;  // donnée du DAC
      break;

    case 0x2B:
      if (YM2612->DAC ^ (data & 0x80))
        YM2612_Special_Update(YM2612);

      YM2612->DAC = data & 0x80;  // Activate / Deactivate the DAC.
      break;
  }

  return 0;
}